

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

void asmjit::v1_14::BaseEmitter_updateForcedOptions(BaseEmitter *self)

{
  long in_RDI;
  bool bVar1;
  bool hasDiagnosticOptions;
  bool emitComments;
  undefined1 local_9a;
  
  if (*(char *)(in_RDI + 8) == '\x01') {
    bVar1 = false;
    if (*(long *)(in_RDI + 0x30) != 0) {
      bVar1 = *(long *)(in_RDI + 0x38) != 0;
    }
    local_9a = Support::test<asmjit::v1_14::DiagnosticOptions,asmjit::v1_14::DiagnosticOptions>
                         (*(DiagnosticOptions *)(in_RDI + 0x10),kValidateAssembler);
  }
  else {
    bVar1 = *(long *)(in_RDI + 0x30) != 0;
    local_9a = Support::test<asmjit::v1_14::DiagnosticOptions,asmjit::v1_14::DiagnosticOptions>
                         (*(DiagnosticOptions *)(in_RDI + 0x10),kValidateIntermediate);
  }
  if (bVar1) {
    *(byte *)(in_RDI + 9) = *(byte *)(in_RDI + 9) | 8;
  }
  else {
    *(byte *)(in_RDI + 9) = *(byte *)(in_RDI + 9) & *(byte *)(in_RDI + 9) & 0xf7;
  }
  if (((*(long *)(in_RDI + 0x30) == 0) || (*(long *)(in_RDI + 0x38) != 0)) || (local_9a != false)) {
    *(uint *)(in_RDI + 0x24) = *(uint *)(in_RDI + 0x24) | 1;
  }
  else {
    *(uint *)(in_RDI + 0x24) = *(uint *)(in_RDI + 0x24) & 0xfffffffe;
  }
  return;
}

Assistant:

static ASMJIT_NOINLINE void BaseEmitter_updateForcedOptions(BaseEmitter* self) noexcept {
  bool emitComments = false;
  bool hasDiagnosticOptions = false;

  if (self->emitterType() == EmitterType::kAssembler) {
    // Assembler: Don't emit comments if logger is not attached.
    emitComments = self->_code != nullptr && self->_logger != nullptr;
    hasDiagnosticOptions = self->hasDiagnosticOption(DiagnosticOptions::kValidateAssembler);
  }
  else {
    // Builder/Compiler: Always emit comments, we cannot assume they won't be used.
    emitComments = self->_code != nullptr;
    hasDiagnosticOptions = self->hasDiagnosticOption(DiagnosticOptions::kValidateIntermediate);
  }

  if (emitComments)
    self->_addEmitterFlags(EmitterFlags::kLogComments);
  else
    self->_clearEmitterFlags(EmitterFlags::kLogComments);

  // The reserved option tells emitter (Assembler/Builder/Compiler) that there may be either a border
  // case (CodeHolder not attached, for example) or that logging or validation is required.
  if (self->_code == nullptr || self->_logger || hasDiagnosticOptions)
    self->_forcedInstOptions |= InstOptions::kReserved;
  else
    self->_forcedInstOptions &= ~InstOptions::kReserved;
}